

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_rgba_hex(char *rgb)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  char *c;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  bVar10 = *rgb == '#';
  lVar8 = 0;
  uVar3 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar8 + (ulong)bVar10];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = bVar1 - 0x30;
    }
    uVar3 = uVar3 * 0x10 + iVar4;
    lVar8 = 1;
    uVar5 = 0;
    bVar2 = false;
  } while (bVar6);
  lVar8 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar8 + (ulong)bVar10 + 2];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = bVar1 - 0x30;
    }
    uVar5 = uVar5 * 0x10 + iVar4;
    lVar8 = 1;
    uVar7 = 0;
    bVar2 = false;
  } while (bVar6);
  lVar8 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar8 + (ulong)bVar10 + 4];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = bVar1 - 0x30;
    }
    uVar7 = uVar7 * 0x10 + iVar4;
    lVar8 = 1;
    iVar4 = 0;
    bVar2 = false;
  } while (bVar6);
  lVar8 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    bVar1 = rgb[lVar8 + (ulong)bVar10 + 6];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar9 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar9 = bVar1 - 0x37;
    }
    else {
      iVar9 = bVar1 - 0x30;
    }
    iVar4 = iVar4 * 0x10 + iVar9;
    lVar8 = 1;
    bVar2 = false;
  } while (bVar6);
  return (nk_color)(uVar3 & 0xff | (uVar5 & 0xff) << 8 | (uVar7 & 0xff) << 0x10 | iVar4 * 0x1000000)
  ;
}

Assistant:

NK_API struct nk_color
nk_rgba_hex(const char *rgb)
{
    struct nk_color col;
    const char *c = rgb;
    if (*c == '#') c++;
    col.r = (nk_byte)nk_parse_hex(c, 2);
    col.g = (nk_byte)nk_parse_hex(c+2, 2);
    col.b = (nk_byte)nk_parse_hex(c+4, 2);
    col.a = (nk_byte)nk_parse_hex(c+6, 2);
    return col;
}